

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O0

void combine_iteration_histograms
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *iteration_histograms_per_thread,
               vector<int,_std::allocator<int>_> *combined_iterations_histogram)

{
  const_reference pvVar1;
  const_iterator __first;
  const_iterator __last;
  iterator __result;
  const_iterator cVar2;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __first_00;
  vector<int,_std::allocator<int>_> *combined_iterations_histogram_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *iteration_histograms_per_thread_local;
  
  pvVar1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::front(iteration_histograms_per_thread);
  __first = std::vector<int,_std::allocator<int>_>::cbegin(pvVar1);
  pvVar1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::front(iteration_histograms_per_thread);
  __last = std::vector<int,_std::allocator<int>_>::cend(pvVar1);
  __result = std::vector<int,_std::allocator<int>_>::begin(combined_iterations_histogram);
  std::
  copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __first._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __last._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__result._M_current)
  ;
  cVar2 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::cbegin(iteration_histograms_per_thread);
  __first_00 = std::
               next<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
                         ((__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                           )cVar2._M_current,1);
  cVar2 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::cend(iteration_histograms_per_thread);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,combine_iteration_histograms(std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<int,std::allocator<int>>&)::__0>
            (__first_00,
             (__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              )cVar2._M_current,(anon_class_8_1_6cde8eb5)combined_iterations_histogram);
  return;
}

Assistant:

void combine_iteration_histograms(const std::vector<std::vector<int>>& iteration_histograms_per_thread, std::vector<int>& combined_iterations_histogram)
{
    std::copy(iteration_histograms_per_thread.front().cbegin(), iteration_histograms_per_thread.front().cend(), combined_iterations_histogram.begin());

    std::for_each(std::next(iteration_histograms_per_thread.cbegin()), iteration_histograms_per_thread.cend(), [&](auto& hist) {
        std::transform(hist.cbegin(), hist.cend(), combined_iterations_histogram.cbegin(), combined_iterations_histogram.begin(), std::plus<>{});
    });
}